

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O3

Vec_Ptr_t * Abc_MfsComputeDivisors(Mfs_Man_t *p,Abc_Obj_t *pNode,int nLevDivMax)

{
  undefined4 uVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  void *pvVar6;
  uint uVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  Mfs_Par_t *pMVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  uint Fill;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 uVar16;
  undefined8 extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  size_t sVar21;
  long lVar22;
  int iVar23;
  long *plVar24;
  ulong local_60;
  
  if (p->vDivs != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vDivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                  ,199,"Vec_Ptr_t *Abc_MfsComputeDivisors(Mfs_Man_t *, Abc_Obj_t *, int)");
  }
  pAVar2 = pNode->pNtk;
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    iVar14 = pAVar2->vObjs->nSize;
    uVar17 = (long)iVar14 + 500;
    iVar13 = (int)uVar17;
    if ((pAVar2->vTravIds).nCap < iVar13) {
      piVar8 = (int *)malloc(uVar17 * 4);
      (pAVar2->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_0044bfb3;
      (pAVar2->vTravIds).nCap = iVar13;
    }
    else {
      piVar8 = (int *)0x0;
    }
    if (-500 < iVar14) {
      memset(piVar8,0,(uVar17 & 0xffffffff) << 2);
    }
    (pAVar2->vTravIds).nSize = iVar13;
  }
  iVar14 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar14 + 1;
  if (iVar14 < 0x3fffffff) {
    pVVar9 = Abc_MfsWinMarkTfi(pNode);
    iVar14 = pVVar9->nSize;
    pAVar2 = pNode->pNtk;
    if ((pAVar2->vTravIds).pArray == (int *)0x0) {
      iVar13 = pAVar2->vObjs->nSize;
      uVar17 = (long)iVar13 + 500;
      iVar23 = (int)uVar17;
      if ((pAVar2->vTravIds).nCap < iVar23) {
        piVar8 = (int *)malloc(uVar17 * 4);
        (pAVar2->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_0044bfb3:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar2->vTravIds).nCap = iVar23;
      }
      else {
        piVar8 = (int *)0x0;
      }
      if (-500 < iVar13) {
        memset(piVar8,0,(uVar17 & 0xffffffff) << 2);
      }
      (pAVar2->vTravIds).nSize = iVar23;
    }
    iVar13 = pAVar2->nTravIds;
    pAVar2->nTravIds = iVar13 + 1;
    if (iVar13 < 0x3fffffff) {
      Abc_MfsWinSweepLeafTfo_rec(pNode,nLevDivMax);
      if (0 < (pNode->vFanins).nSize) {
        lVar18 = 0;
        uVar16 = extraout_RDX;
        do {
          plVar24 = (long *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar18]];
          lVar22 = *plVar24;
          iVar13 = (int)plVar24[2];
          uVar1 = *(undefined4 *)(lVar22 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar22 + 0xe0),iVar13 + 1,(int)uVar16);
          if (((long)iVar13 < 0) || (*(int *)(lVar22 + 0xe4) <= iVar13)) {
LAB_0044bf56:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(lVar22 + 0xe8) + (long)iVar13 * 4) = uVar1;
          lVar18 = lVar18 + 1;
          uVar16 = extraout_RDX_00;
        } while (lVar18 < (pNode->vFanins).nSize);
      }
      uVar7 = p->pPars->nWinMax;
      pVVar10 = (Vec_Ptr_t *)malloc(0x10);
      local_60 = 8;
      if (6 < uVar7 - 1) {
        local_60 = (ulong)uVar7;
      }
      pVVar10->nSize = 0;
      iVar13 = (int)local_60;
      pVVar10->nCap = iVar13;
      if (iVar13 == 0) {
        ppvVar11 = (void **)0x0;
        iVar13 = extraout_EDX;
      }
      else {
        ppvVar11 = (void **)malloc((long)iVar13 << 3);
        iVar13 = extraout_EDX_00;
      }
      pVVar10->pArray = ppvVar11;
      uVar7 = 0;
      if (0 < iVar14) {
        plVar24 = (long *)*pVVar9->pArray;
        lVar18 = *plVar24;
        uVar7 = *(uint *)(plVar24 + 2);
        Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),uVar7 + 1,iVar13);
        if (-1 < (int)uVar7) {
          uVar19 = 0;
          uVar20 = 0;
          do {
            if (*(int *)(lVar18 + 0xe4) <= (int)uVar7) break;
            Fill = *(int *)(*plVar24 + 0xd8) - 1;
            if ((*(uint *)(*(long *)(lVar18 + 0xe8) + (ulong)uVar7 * 4) == Fill) &&
               ((int)(*(uint *)((long)plVar24 + 0x14) >> 0xc) <= nLevDivMax)) {
              uVar7 = (uint)local_60;
              if (uVar20 == uVar7) {
                if ((int)uVar7 < 0x10) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar11 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
                  }
                  pVVar10->pArray = ppvVar11;
                  pVVar10->nCap = 0x10;
                  local_60 = 0x10;
                }
                else {
                  local_60 = (ulong)(uVar7 * 2);
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar11 = (void **)malloc(local_60 * 8);
                  }
                  else {
                    ppvVar11 = (void **)realloc(pVVar10->pArray,local_60 * 8);
                  }
                  pVVar10->pArray = ppvVar11;
                  pVVar10->nCap = uVar7 * 2;
                }
              }
              else {
                ppvVar11 = pVVar10->pArray;
              }
              uVar7 = uVar20 + 1;
              pVVar10->nSize = uVar7;
              ppvVar11[(int)uVar20] = plVar24;
              Fill = uVar20;
              uVar20 = uVar7;
              if (p->pPars->nWinMax <= (int)uVar7) goto LAB_0044ba25;
            }
            uVar19 = uVar19 + 1;
            uVar7 = uVar20;
            if (iVar14 <= (int)uVar19) goto LAB_0044ba25;
            plVar24 = (long *)pVVar9->pArray[uVar19];
            lVar18 = *plVar24;
            uVar7 = *(uint *)(plVar24 + 2);
            Vec_IntFillExtra((Vec_Int_t *)(lVar18 + 0xe0),uVar7 + 1,Fill);
          } while (-1 < (int)uVar7);
        }
LAB_0044bf2a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
LAB_0044ba25:
      if (pVVar9->pArray != (void **)0x0) {
        free(pVVar9->pArray);
      }
      free(pVVar9);
      pMVar12 = p->pPars;
      iVar14 = pMVar12->nWinMax;
      if ((int)uVar7 < iVar14) {
        if (0 < (int)uVar7) {
          lVar18 = 0;
          uVar17 = extraout_RDX_01;
          do {
            plVar24 = (long *)pVVar10->pArray[lVar18];
            if (0 < *(int *)((long)plVar24 + 0x2c)) {
              lVar22 = 0;
              do {
                pMVar12 = p->pPars;
                lVar15 = (long)pMVar12->nFanoutsMax;
                if (lVar15 != 0 && lVar15 < lVar22) goto LAB_0044bda9;
                plVar3 = *(long **)(*(long *)(*(long *)(*plVar24 + 0x20) + 8) +
                                   (long)*(int *)(plVar24[6] + lVar22 * 4) * 8);
                lVar4 = *plVar3;
                iVar14 = (int)plVar3[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar14 + 1,
                                 (int)CONCAT71((int7)(uVar17 >> 8),lVar15 != 0));
                if (((long)iVar14 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar14)) {
LAB_0044bf1d:
                  pVVar10->nSize = uVar7;
                  goto LAB_0044bf2a;
                }
                lVar15 = *plVar3;
                uVar17 = extraout_RDX_02;
                if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar14 * 4) !=
                    *(int *)(lVar15 + 0xd8) + -1) {
                  iVar14 = (int)plVar3[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar14 + 1,(int)extraout_RDX_02);
                  if (((long)iVar14 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar14)) goto LAB_0044bf1d;
                  uVar17 = extraout_RDX_03;
                  if ((*(int *)(*(long *)(lVar15 + 0xe8) + (long)iVar14 * 4) !=
                       *(int *)(*plVar3 + 0xd8)) &&
                     ((int)(*(uint *)((long)plVar3 + 0x14) >> 0xc) <= nLevDivMax &&
                      (*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
                    iVar14 = *(int *)((long)plVar3 + 0x1c);
                    lVar15 = 0;
                    iVar13 = 0;
                    if (0 < iVar14) {
                      do {
                        plVar5 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                           (long)*(int *)(plVar3[4] + lVar15 * 4) * 8);
                        lVar4 = *plVar5;
                        iVar13 = (int)plVar5[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar13 + 1,(int)uVar17);
                        if (((long)iVar13 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar13))
                        goto LAB_0044bf1d;
                        uVar20 = *(int *)(*plVar5 + 0xd8) - 1;
                        uVar17 = (ulong)uVar20;
                        iVar14 = *(int *)((long)plVar3 + 0x1c);
                      } while ((*(uint *)(*(long *)(lVar4 + 0xe8) + (long)iVar13 * 4) == uVar20) &&
                              (lVar15 = lVar15 + 1, lVar15 < iVar14));
                      iVar13 = (int)lVar15;
                    }
                    uVar20 = (uint)uVar17;
                    if (iVar14 <= iVar13) {
                      uVar19 = (uint)local_60;
                      if (uVar7 == uVar19) {
                        if ((int)uVar19 < 0x10) {
                          if (pVVar10->pArray == (void **)0x0) {
                            ppvVar11 = (void **)malloc(0x80);
                            uVar20 = extraout_EDX_02;
                          }
                          else {
                            ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
                            uVar20 = extraout_EDX_01;
                          }
                          pVVar10->pArray = ppvVar11;
                          pVVar10->nCap = 0x10;
                          local_60 = 0x10;
                        }
                        else {
                          uVar20 = uVar19 * 2;
                          local_60 = (ulong)uVar20;
                          if (pVVar10->pArray == (void **)0x0) {
                            ppvVar11 = (void **)malloc(local_60 * 8);
                          }
                          else {
                            ppvVar11 = (void **)realloc(pVVar10->pArray,local_60 * 8);
                          }
                          pVVar10->pArray = ppvVar11;
                          pVVar10->nCap = uVar20;
                        }
                      }
                      else {
                        ppvVar11 = pVVar10->pArray;
                      }
                      ppvVar11[(int)uVar7] = plVar3;
                      pVVar9 = p->vNodes;
                      iVar14 = pVVar9->nSize;
                      if (0 < (long)iVar14) {
                        lVar15 = 0;
                        do {
                          if ((long *)pVVar9->pArray[lVar15] == plVar3) goto LAB_0044bd35;
                          lVar15 = lVar15 + 1;
                        } while (iVar14 != lVar15);
                      }
                      if (iVar14 == pVVar9->nCap) {
                        if (iVar14 < 0x10) {
                          if (pVVar9->pArray == (void **)0x0) {
                            ppvVar11 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar11 = (void **)realloc(pVVar9->pArray,0x80);
                          }
                          pVVar9->pArray = ppvVar11;
                          pVVar9->nCap = 0x10;
                        }
                        else {
                          sVar21 = (ulong)(uint)(iVar14 * 2) * 8;
                          if (pVVar9->pArray == (void **)0x0) {
                            ppvVar11 = (void **)malloc(sVar21);
                          }
                          else {
                            ppvVar11 = (void **)realloc(pVVar9->pArray,sVar21);
                          }
                          pVVar9->pArray = ppvVar11;
                          pVVar9->nCap = iVar14 * 2;
                        }
                      }
                      else {
                        ppvVar11 = pVVar9->pArray;
                      }
                      iVar14 = pVVar9->nSize;
                      uVar20 = iVar14 + 1;
                      pVVar9->nSize = uVar20;
                      ppvVar11[iVar14] = plVar3;
LAB_0044bd35:
                      uVar7 = uVar7 + 1;
                      lVar15 = *plVar3;
                      iVar14 = (int)plVar3[2];
                      iVar13 = *(int *)(lVar15 + 0xd8);
                      Vec_IntFillExtra((Vec_Int_t *)(lVar15 + 0xe0),iVar14 + 1,uVar20);
                      if (((long)iVar14 < 0) || (*(int *)(lVar15 + 0xe4) <= iVar14)) {
                        pVVar10->nSize = uVar7;
                        goto LAB_0044bf56;
                      }
                      *(int *)(*(long *)(lVar15 + 0xe8) + (long)iVar14 * 4) = iVar13 + -1;
                      pMVar12 = p->pPars;
                      uVar17 = extraout_RDX_04;
                      if (pMVar12->nWinMax <= (int)uVar7) goto LAB_0044bda9;
                    }
                  }
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < *(int *)((long)plVar24 + 0x2c));
              pMVar12 = p->pPars;
            }
LAB_0044bda9:
            iVar14 = pMVar12->nWinMax;
            if (iVar14 <= (int)uVar7) break;
            lVar18 = lVar18 + 1;
            uVar17 = (ulong)(int)uVar7;
          } while (lVar18 < (long)uVar17);
        }
        pVVar10->nSize = uVar7;
      }
      p->nMaxDivs = p->nMaxDivs + (uint)(iVar14 <= (int)uVar7);
      if (1 < (int)uVar7) {
        qsort(pVVar10->pArray,(ulong)uVar7,8,Abc_NodeCompareLevelsIncrease);
      }
      if (0 < (pNode->vFanins).nSize) {
        lVar18 = (long)(int)uVar7;
        uVar20 = uVar7 * 2;
        sVar21 = lVar18 << 4;
        lVar22 = 0;
        do {
          pvVar6 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar22]];
          if (uVar7 + (int)lVar22 == (int)local_60) {
            ppvVar11 = pVVar10->pArray;
            if (lVar18 + lVar22 < 0x10) {
              if (ppvVar11 == (void **)0x0) {
                ppvVar11 = (void **)malloc(0x80);
              }
              else {
                ppvVar11 = (void **)realloc(ppvVar11,0x80);
              }
              pVVar10->pArray = ppvVar11;
              local_60 = 0x10;
            }
            else {
              if (ppvVar11 == (void **)0x0) {
                ppvVar11 = (void **)malloc(sVar21);
              }
              else {
                ppvVar11 = (void **)realloc(ppvVar11,sVar21);
              }
              pVVar10->pArray = ppvVar11;
              local_60 = (ulong)uVar20;
            }
          }
          else {
            ppvVar11 = pVVar10->pArray;
          }
          ppvVar11[lVar18 + lVar22] = pvVar6;
          lVar22 = lVar22 + 1;
          uVar20 = uVar20 + 2;
          sVar21 = sVar21 + 0x10;
        } while (lVar22 < (pNode->vFanins).nSize);
        pVVar10->nSize = uVar7 + (int)lVar22;
        pVVar10->nCap = (int)local_60;
      }
      return pVVar10;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_MfsComputeDivisors( Mfs_Man_t * p, Abc_Obj_t * pNode, int nLevDivMax )
{
    Vec_Ptr_t * vCone, * vDivs;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int k, f, m;
    int nDivsPlus = 0, nTrueSupp;
    assert( p->vDivs == NULL );

    // mark the TFI with the current trav ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vCone = Abc_MfsWinMarkTfi( pNode );

    // count the number of PIs
    nTrueSupp = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
        nTrueSupp += Abc_ObjIsCi(pObj);
//    printf( "%d(%d) ", Vec_PtrSize(p->vSupp), m );

    // mark with the current trav ID those nodes that should not be divisors:
    // (1) the node and its TFO
    // (2) the MFFC of the node
    // (3) the node's fanins (these are treated as a special case)
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_MfsWinSweepLeafTfo_rec( pNode, nLevDivMax );
//    Abc_MfsWinVisitMffc( pNode );
    Abc_ObjForEachFanin( pNode, pObj, k )
        Abc_NodeSetTravIdCurrent( pObj );

    // at this point the nodes are marked with two trav IDs:
    // nodes to be collected as divisors are marked with previous trav ID
    // nodes to be avoided as divisors are marked with current trav ID

    // start collecting the divisors
    vDivs = Vec_PtrAlloc( p->pPars->nWinMax );
    Vec_PtrForEachEntry( Abc_Obj_t *, vCone, pObj, k )
    {
        if ( !Abc_NodeIsTravIdPrevious(pObj) )
            continue;
        if ( (int)pObj->Level > nLevDivMax )
            continue;
        Vec_PtrPush( vDivs, pObj );
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    Vec_PtrFree( vCone );

    // explore the fanouts of already collected divisors
    if ( Vec_PtrSize(vDivs) < p->pPars->nWinMax )
    Vec_PtrForEachEntry( Abc_Obj_t *, vDivs, pObj, k )
    {
        // consider fanouts of this node
        Abc_ObjForEachFanout( pObj, pFanout, f )
        {
            // stop if there are too many fanouts
            if ( p->pPars->nFanoutsMax && f > p->pPars->nFanoutsMax )
                break;
            // skip nodes that are already added
            if ( Abc_NodeIsTravIdPrevious(pFanout) )
                continue;
            // skip nodes in the TFO or in the MFFC of node
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // skip COs
            if ( !Abc_ObjIsNode(pFanout) ) 
                continue;
            // skip nodes with large level
            if ( (int)pFanout->Level > nLevDivMax )
                continue;
            // skip nodes whose fanins are not divisors  -- here we skip more than we need to skip!!! (revise later)  August 7, 2009
            Abc_ObjForEachFanin( pFanout, pFanin, m )
                if ( !Abc_NodeIsTravIdPrevious(pFanin) )
                    break;
            if ( m < Abc_ObjFaninNum(pFanout) )
                continue;
            // make sure this divisor in not among the nodes
//            Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pFanin, m )
//                assert( pFanout != pFanin );
            // add the node to the divisors
            Vec_PtrPush( vDivs, pFanout );
//            Vec_PtrPush( p->vNodes, pFanout );
            Vec_PtrPushUnique( p->vNodes, pFanout );
            Abc_NodeSetTravIdPrevious( pFanout );
            nDivsPlus++;
            if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
                break;
        }
        if ( Vec_PtrSize(vDivs) >= p->pPars->nWinMax )
            break;
    }
    p->nMaxDivs += (Vec_PtrSize(vDivs) >= p->pPars->nWinMax);

    // sort the divisors by level in the increasing order
    Vec_PtrSort( vDivs, (int (*)(void))Abc_NodeCompareLevelsIncrease );

    // add the fanins of the node
    Abc_ObjForEachFanin( pNode, pFanin, k )
        Vec_PtrPush( vDivs, pFanin );

/*
    printf( "Node level = %d.  ", Abc_ObjLevel(p->pNode) );
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDivs, pObj, k, Vec_PtrSize(vDivs)-p->nDivsPlus )
        printf( "%d ", Abc_ObjLevel(pObj) );
    printf( "\n" );
*/
//printf( "%d ", p->nDivsPlus );
//    printf( "(%d+%d)(%d+%d+%d) ", Vec_PtrSize(p->vSupp), Vec_PtrSize(p->vNodes), 
//        nTrueSupp, Vec_PtrSize(vDivs)-nTrueSupp-nDivsPlus, nDivsPlus );
    return vDivs;
}